

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

vmdict_TrieNode * __thiscall vmdict_TrieNode::find_word(vmdict_TrieNode *this,char *str,size_t len)

{
  wchar_t wVar1;
  vmdict_TrieNode **ppvVar2;
  utf8_ptr p;
  utf8_ptr local_28;
  size_t local_20;
  
  local_28.p_ = str;
  local_20 = len;
  do {
    if (local_20 == 0) {
      return this;
    }
    wVar1 = utf8_ptr::s_getch(local_28.p_);
    ppvVar2 = &this->chi;
    while( true ) {
      this = *ppvVar2;
      if (this == (vmdict_TrieNode *)0x0) {
        return (vmdict_TrieNode *)0x0;
      }
      if (this->ch == wVar1) break;
      ppvVar2 = &this->nxt;
    }
    utf8_ptr::inc(&local_28,&local_20);
  } while( true );
}

Assistant:

vmdict_TrieNode *vmdict_TrieNode::find_word(const char *str, size_t len)
{
    vmdict_TrieNode *n;
    utf8_ptr p((char *)str);

    /* scan the string and walk the Trie */
    for (n = this ; len != 0 ; p.inc(&len))
    {
        /* get this character */
        wchar_t ch = p.getch();

        /* find the child node for this letter */
        vmdict_TrieNode *chi;
        for (chi = n->chi ; chi != 0 && chi->ch != ch ; chi = chi->nxt) ;

        /* if we didn't find a child, the word isn't in the trie */
        if (chi == 0)
            return 0;

        /* advance to this child node */
        n = chi;
    }

    /* we've reached the final node for the word - return it */
    return n;
}